

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O0

void __thiscall tiger::trains::ai::LineBlocker::makeOwnBlockLines(LineBlocker *this)

{
  bool bVar1;
  int iVar2;
  PostType PVar3;
  PostType PVar4;
  reference ppVar5;
  reference ppTVar6;
  Line *pLVar7;
  reference ppIVar8;
  reference ppLVar9;
  Point *pPVar10;
  LineBlocker *in_RDI;
  pair<std::_Rb_tree_const_iterator<tiger::trains::ai::LineBlock>,_bool> pVar11;
  Line *line;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *__range2;
  IPost *post;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *__range1_2;
  Train *trainA;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range1_1;
  pair<int,_tiger::trains::ai::LineBlock> blockLine;
  iterator __end1;
  iterator __begin1;
  set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *__range1;
  World *world;
  CollisionAllower allower;
  set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *in_stack_fffffffffffffe98;
  Line *in_stack_fffffffffffffea0;
  Line *in_stack_fffffffffffffeb8;
  set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
  *in_stack_fffffffffffffec0;
  Train *in_stack_fffffffffffffec8;
  Train *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LineBlock local_108;
  Line *local_f8;
  Line **local_f0;
  __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  local_e8;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *local_e0;
  IPost *local_d8;
  IPost **local_d0;
  __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
  local_c8;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  LineBlock local_a8;
  _Base_ptr local_98;
  undefined1 local_90;
  LineBlock local_88;
  Train *local_78;
  Train **local_70;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_68;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *local_60;
  _Base_ptr local_58;
  undefined1 local_50;
  undefined8 local_48;
  Line *local_40;
  Point *local_38;
  _Self local_30;
  _Self local_28;
  set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *local_20;
  World *local_18;
  CollisionAllower local_10 [2];
  
  CollisionAllower::CollisionAllower(local_10);
  local_18 = trains::world::Train::getWorld(in_RDI->train);
  std::
  set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
  ::clear((set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
           *)0x2525cc);
  local_20 = in_RDI->blockLines;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
       ::begin(in_stack_fffffffffffffe98);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
       ::end(in_stack_fffffffffffffe98);
  while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_> *)
                        in_stack_fffffffffffffea0);
    local_48 = *(undefined8 *)ppVar5;
    local_40 = (ppVar5->second).line;
    local_38 = (ppVar5->second).inPoint;
    in_stack_fffffffffffffedc = (int)local_48;
    iVar2 = trains::world::Train::getIdx(in_RDI->train);
    if (in_stack_fffffffffffffedc != iVar2) {
      pVar11 = std::
               set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
               ::insert(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
      local_58 = (_Base_ptr)pVar11.first._M_node;
      local_50 = pVar11.second;
    }
    std::_Rb_tree_const_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_> *)
               in_stack_fffffffffffffea0);
  }
  local_60 = trains::world::World::getTrainList(local_18);
  local_68._M_current =
       (Train **)
       std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
       begin((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              *)in_stack_fffffffffffffe98);
  local_70 = (Train **)
             std::
             vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
             end((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  *)in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    ppTVar6 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
              ::operator*(&local_68);
    local_78 = *ppTVar6;
    bVar1 = CollisionAllower::isCollisionAllow
                      ((CollisionAllower *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (bVar1) {
      in_stack_fffffffffffffec0 = &in_RDI->ownBlockLine;
      in_stack_fffffffffffffeb8 = trains::world::Train::getLine(local_78);
      pLVar7 = trains::world::Train::getLine(local_78);
      pPVar10 = trains::world::Line::getStartPont(pLVar7);
      LineBlock::LineBlock(&local_88,in_stack_fffffffffffffeb8,pPVar10);
      pVar11 = std::
               set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
               ::insert(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
      local_98 = (_Base_ptr)pVar11.first._M_node;
      local_90 = pVar11.second;
      in_stack_fffffffffffffed0 = (Train *)&in_RDI->ownBlockLine;
      in_stack_fffffffffffffec8 = (Train *)trains::world::Train::getLine(local_78);
      pLVar7 = trains::world::Train::getLine(local_78);
      pPVar10 = trains::world::Line::getEndPont(pLVar7);
      LineBlock::LineBlock(&local_a8,(Line *)in_stack_fffffffffffffec8,pPVar10);
      pVar11 = std::
               set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
               ::insert(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
      local_b8 = (_Base_ptr)pVar11.first._M_node;
      local_b0 = pVar11.second;
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
    ::operator++(&local_68);
  }
  local_c0 = trains::world::World::getPostList(local_18);
  local_c8._M_current =
       (IPost **)
       std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
       begin((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
              *)in_stack_fffffffffffffe98);
  local_d0 = (IPost **)
             std::
             vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
             end((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                  *)in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    ppIVar8 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
              ::operator*(&local_c8);
    local_d8 = *ppIVar8;
    iVar2 = (*local_d8->_vptr_IPost[7])();
    if (iVar2 != 1) {
      PVar3 = (*local_d8->_vptr_IPost[7])();
      PVar4 = getPostTypeByGood(in_RDI,in_RDI->type);
      if (PVar3 != PVar4) {
        (*local_d8->_vptr_IPost[5])();
        local_e0 = trains::world::Point::getEdges((Point *)0x25290e);
        local_e8._M_current =
             (Line **)std::
                      vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                      ::begin((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                               *)in_stack_fffffffffffffe98);
        local_f0 = (Line **)std::
                            vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                            ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                                   *)in_stack_fffffffffffffe98);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                                   *)in_stack_fffffffffffffea0,
                                  (__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                                   *)in_stack_fffffffffffffe98), bVar1) {
          ppLVar9 = __gnu_cxx::
                    __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                    ::operator*(&local_e8);
          in_stack_fffffffffffffea0 = *ppLVar9;
          local_f8 = in_stack_fffffffffffffea0;
          pPVar10 = trains::world::Line::getStartPont(in_stack_fffffffffffffea0);
          LineBlock::LineBlock(&local_108,in_stack_fffffffffffffea0,pPVar10);
          std::
          set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
          ::insert(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
          __gnu_cxx::
          __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
          ::operator++(&local_e8);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
    ::operator++(&local_c8);
  }
  return;
}

Assistant:

void LineBlocker::makeOwnBlockLines()
{
    CollisionAllower allower;

    world::World *world = train->getWorld();


    ownBlockLine.clear();

    for (auto blockLine: *blockLines)
    {
        if (blockLine.first != train->getIdx())
        {
            ownBlockLine.insert(blockLine.second);
        }
    }

    for(auto trainA : world->getTrainList())
    {

        if (allower.isCollisionAllow(train, trainA))
        {
            ownBlockLine.insert({trainA->getLine(),trainA->getLine()->getStartPont()});
            ownBlockLine.insert({trainA->getLine(),trainA->getLine()->getEndPont()});
        }

    }

    for(auto post : world->getPostList())

    {
        if (post->getPostType() == models::PostType::TOWN ||
                post->getPostType() == getPostTypeByGood(type))
            continue;

        for (auto line : post->getPoint()->getEdges())
        {
            ownBlockLine.insert({line, line->getStartPont()});
        }
    }
}